

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Pi<(moira::Mode)3,_4> wrapper)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  An local_28;
  An local_24;
  Ea<(moira::Mode)3,_4> *local_20;
  Ea<(moira::Mode)3,_4> *ea;
  StrWriter *this_local;
  Pi<(moira::Mode)3,_4> wrapper_local;
  
  SVar1 = this->style->syntax;
  local_20 = wrapper.ea;
  ea = (Ea<(moira::Mode)3,_4> *)this;
  this_local = (StrWriter *)wrapper.ea;
  if (SVar1 != MOIRA) {
    if (SVar1 == MOIRA_MIT) {
LAB_00327a99:
      An::An(&local_28,(uint)(wrapper.ea)->reg);
      pSVar2 = operator<<(this,local_28);
      operator<<(pSVar2,"@+");
      return this;
    }
    if (SVar1 != GNU) {
      if (SVar1 == GNU_MIT) goto LAB_00327a99;
      if (SVar1 != MUSASHI) {
        return this;
      }
    }
  }
  pSVar2 = operator<<(this,"(");
  An::An(&local_24,(uint)local_20->reg);
  pSVar2 = operator<<(pSVar2,local_24);
  operator<<(pSVar2,")+");
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pi<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:
       case Syntax::GNU:

            *this << "(" << An{ea.reg} << ")+";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@+";
            break;
    }

    return *this;
}